

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::AssertionInstanceExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (AssertionInstanceExpression *this,MonitorVisitor *visitor)

{
  pointer ppSVar1;
  size_type sVar2;
  DeclaredType *this_00;
  Expression *this_01;
  long lVar3;
  
  AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>(this->body,visitor);
  ppSVar1 = (this->localVars).data_;
  sVar2 = (this->localVars).size_;
  lVar3 = 0;
  while( true ) {
    if (sVar2 << 3 == lVar3) {
      return;
    }
    this_00 = Symbol::getDeclaredType(*(Symbol **)((long)ppSVar1 + lVar3));
    if (this_00 == (DeclaredType *)0x0) break;
    this_01 = DeclaredType::getInitializer(this_00);
    if (this_01 != (Expression *)0x0) {
      Expression::visit<slang::ast::builtins::MonitorVisitor&>(this_01,visitor);
    }
    lVar3 = lVar3 + 8;
  }
  assert::assertFailed
            ("dt",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/expressions/MiscExpressions.h"
             ,0xe4,
             "void slang::ast::AssertionInstanceExpression::visitExprs(TVisitor &&) const [TVisitor = slang::ast::builtins::MonitorVisitor &]"
            );
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        body.visit(visitor);
        for (auto sym : localVars) {
            auto dt = sym->getDeclaredType();
            ASSERT(dt);
            if (auto init = dt->getInitializer())
                init->visit(visitor);
        }
    }